

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool basist::transcode_uastc_to_pvrtc1_4_rgba
               (uastc_block *pSrc_blocks,void *pDst_blocks,uint32_t num_blocks_x,
               uint32_t num_blocks_y,bool high_quality)

{
  uint uVar1;
  uint uVar2;
  anon_union_4_3_898e29d3_for_color32_0 aVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  byte bVar38;
  int iVar39;
  int iVar40;
  void *pvVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  ulong uVar51;
  uint uVar52;
  int iVar53;
  uint *puVar54;
  int iVar55;
  long lVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  ulong uVar60;
  int iVar61;
  uastc_block *blk;
  anon_union_4_3_898e29d3_for_color32_0 *paVar62;
  bool bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  color32 block_pixels [16];
  uint32_t *pE_rows [3];
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  anon_union_4_3_898e29d3_for_color32_0 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  byte bStack_29c;
  byte bStack_29b;
  byte bStack_29a;
  byte bStack_299;
  undefined4 uStack_298;
  undefined4 local_294;
  undefined4 local_290;
  byte local_28c;
  byte local_28b;
  byte local_28a;
  byte local_289;
  byte local_288;
  byte local_287;
  byte local_286;
  byte local_285;
  byte local_284;
  byte local_283;
  byte local_282;
  byte local_281;
  byte local_280;
  byte local_27f;
  byte local_27e;
  byte local_27d;
  byte local_27c;
  byte local_27b;
  byte local_27a;
  byte local_279;
  byte local_278;
  byte local_277;
  byte local_276;
  byte local_275;
  byte local_274;
  byte local_273;
  byte local_272;
  byte local_271;
  byte local_270;
  byte local_26f;
  byte local_26e;
  byte local_26d;
  byte local_26c;
  byte local_26b;
  byte local_26a;
  byte local_269;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  void *local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  uint local_20c;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  ulong local_198;
  ulong local_190;
  void *local_188;
  uastc_block *local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  anon_union_4_3_898e29d3_for_color32_0 local_138;
  uint uStack_134;
  undefined4 local_130;
  uint uStack_12c;
  undefined4 local_128;
  uint uStack_124;
  undefined4 local_120;
  uint uStack_11c;
  undefined4 local_118;
  uint uStack_114;
  byte local_110;
  byte local_10f;
  byte local_10e;
  byte local_10d;
  uint local_10c;
  undefined4 local_108;
  uint uStack_104;
  undefined4 local_100;
  uint uStack_fc;
  long local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_88;
  uint local_84;
  uint local_80;
  elemental_vector local_58;
  long local_48 [3];
  undefined4 extraout_var_01;
  short sVar79;
  short sVar96;
  
  if (((num_blocks_y == 0 || num_blocks_x == 0) ||
      (uVar19 = num_blocks_x * 4 - 1, (num_blocks_x * 4 ^ uVar19) <= uVar19)) ||
     (uVar19 = num_blocks_y * 4 - 1, (num_blocks_y * 4 ^ uVar19) <= uVar19)) {
    bVar63 = false;
  }
  else {
    uVar19 = num_blocks_y * num_blocks_x;
    local_58.m_p = (void *)0x0;
    local_58.m_size = 0;
    local_58.m_capacity = 0;
    local_188 = pDst_blocks;
    local_180 = pSrc_blocks;
    if (uVar19 == 0) {
      local_250 = (void *)0x0;
    }
    else {
      basisu::elemental_vector::increase_capacity
                (&local_58,uVar19,uVar19 == 1,4,(object_mover)0x0,false);
      local_250 = local_58.m_p;
      memset((void *)((long)local_58.m_p + (ulong)local_58.m_size * 4),0,
             (ulong)(uVar19 - local_58.m_size) << 2);
    }
    uVar21 = 0;
    local_198 = (ulong)num_blocks_y;
    local_268 = (ulong)num_blocks_x;
    uVar27 = 0;
    bVar63 = false;
    local_1d0 = (ulong)num_blocks_y;
    local_1c8 = (ulong)num_blocks_x;
    do {
      uVar60 = (ulong)uVar21;
      blk = local_180 + uVar60;
      uVar34 = local_268;
      do {
        bVar8 = unpack_uastc(blk,(color32 *)&local_2a8.field_0,false);
        pvVar41 = local_250;
        if (!bVar8) goto LAB_001431af;
        auVar99[0] = (local_2a8.field_0.r < (byte)uStack_2a4) * local_2a8.field_0.r |
                     (local_2a8.field_0.r >= (byte)uStack_2a4) * (byte)uStack_2a4;
        auVar99[1] = 0;
        auVar99[2] = ((byte)uStack_2a0 < bStack_29c) * (byte)uStack_2a0 |
                     ((byte)uStack_2a0 >= bStack_29c) * bStack_29c;
        auVar99[3] = 0;
        auVar99[4] = ((byte)uStack_298 < (byte)local_294) * (byte)uStack_298 |
                     ((byte)uStack_298 >= (byte)local_294) * (byte)local_294;
        auVar99[5] = 0;
        auVar99[6] = ((byte)local_290 < local_28c) * (byte)local_290 |
                     ((byte)local_290 >= local_28c) * local_28c;
        auVar99[7] = 0;
        auVar99[8] = (local_288 < local_284) * local_288 | (local_288 >= local_284) * local_284;
        auVar99[9] = 0;
        auVar99[10] = (local_280 < local_27c) * local_280 | (local_280 >= local_27c) * local_27c;
        auVar99[0xb] = 0;
        auVar99[0xc] = (local_278 < local_274) * local_278 | (local_278 >= local_274) * local_274;
        auVar99[0xd] = 0;
        auVar99[0xe] = (local_270 < local_26c) * local_270 | (local_270 >= local_26c) * local_26c;
        auVar99[0xf] = 0;
        auVar99 = phminposuw(auVar99);
        auVar100[0] = (local_2a8.field_0.g < uStack_2a4._1_1_) * local_2a8.field_0.g |
                      (local_2a8.field_0.g >= uStack_2a4._1_1_) * uStack_2a4._1_1_;
        auVar100[1] = 0;
        auVar100[2] = (uStack_2a0._1_1_ < bStack_29b) * uStack_2a0._1_1_ |
                      (uStack_2a0._1_1_ >= bStack_29b) * bStack_29b;
        auVar100[3] = 0;
        auVar100[4] = (uStack_298._1_1_ < local_294._1_1_) * uStack_298._1_1_ |
                      (uStack_298._1_1_ >= local_294._1_1_) * local_294._1_1_;
        auVar100[5] = 0;
        auVar100[6] = (local_290._1_1_ < local_28b) * local_290._1_1_ |
                      (local_290._1_1_ >= local_28b) * local_28b;
        auVar100[7] = 0;
        auVar100[8] = (local_287 < local_283) * local_287 | (local_287 >= local_283) * local_283;
        auVar100[9] = 0;
        auVar100[10] = (local_27f < local_27b) * local_27f | (local_27f >= local_27b) * local_27b;
        auVar100[0xb] = 0;
        auVar100[0xc] = (local_277 < local_273) * local_277 | (local_277 >= local_273) * local_273;
        auVar100[0xd] = 0;
        auVar100[0xe] = (local_26f < local_26b) * local_26f | (local_26f >= local_26b) * local_26b;
        auVar100[0xf] = 0;
        auVar100 = phminposuw(auVar100);
        auVar101[0] = (local_2a8.field_0.a < uStack_2a4._3_1_) * local_2a8.field_0.a |
                      (local_2a8.field_0.a >= uStack_2a4._3_1_) * uStack_2a4._3_1_;
        auVar101[1] = 0;
        auVar101[2] = (uStack_2a0._3_1_ < bStack_299) * uStack_2a0._3_1_ |
                      (uStack_2a0._3_1_ >= bStack_299) * bStack_299;
        auVar101[3] = 0;
        auVar101[4] = (uStack_298._3_1_ < local_294._3_1_) * uStack_298._3_1_ |
                      (uStack_298._3_1_ >= local_294._3_1_) * local_294._3_1_;
        auVar101[5] = 0;
        auVar101[6] = (local_290._3_1_ < local_289) * local_290._3_1_ |
                      (local_290._3_1_ >= local_289) * local_289;
        auVar101[7] = 0;
        auVar101[8] = (local_285 < local_281) * local_285 | (local_285 >= local_281) * local_281;
        auVar101[9] = 0;
        auVar101[10] = (local_27d < local_279) * local_27d | (local_27d >= local_279) * local_279;
        auVar101[0xb] = 0;
        auVar101[0xc] = (local_275 < local_271) * local_275 | (local_275 >= local_271) * local_271;
        auVar101[0xd] = 0;
        auVar101[0xe] = (local_26d < local_269) * local_26d | (local_26d >= local_269) * local_269;
        auVar101[0xf] = 0;
        auVar101 = phminposuw(auVar101);
        auVar102[0] = (local_2a8.field_0.b < uStack_2a4._2_1_) * local_2a8.field_0.b |
                      (local_2a8.field_0.b >= uStack_2a4._2_1_) * uStack_2a4._2_1_;
        auVar102[1] = 0;
        auVar102[2] = (uStack_2a0._2_1_ < bStack_29a) * uStack_2a0._2_1_ |
                      (uStack_2a0._2_1_ >= bStack_29a) * bStack_29a;
        auVar102[3] = 0;
        auVar102[4] = (uStack_298._2_1_ < local_294._2_1_) * uStack_298._2_1_ |
                      (uStack_298._2_1_ >= local_294._2_1_) * local_294._2_1_;
        auVar102[5] = 0;
        auVar102[6] = (local_290._2_1_ < local_28a) * local_290._2_1_ |
                      (local_290._2_1_ >= local_28a) * local_28a;
        auVar102[7] = 0;
        auVar102[8] = (local_286 < local_282) * local_286 | (local_286 >= local_282) * local_282;
        auVar102[9] = 0;
        auVar102[10] = (local_27e < local_27a) * local_27e | (local_27e >= local_27a) * local_27a;
        auVar102[0xb] = 0;
        auVar102[0xc] = (local_276 < local_272) * local_276 | (local_276 >= local_272) * local_272;
        auVar102[0xd] = 0;
        auVar102[0xe] = (local_26e < local_26a) * local_26e | (local_26e >= local_26a) * local_26a;
        auVar102[0xf] = 0;
        auVar102 = phminposuw(auVar102);
        if (auVar101[0] == -1) {
          if (0x1f < (byte)(g_pvrtc_5_floor[auVar100[0]] | g_pvrtc_5_floor[auVar99[0]])) {
            __assert_fail("(r < 32) && (g < 32) && (b < 16)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc4e,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          uVar20 = (uint)(byte)g_pvrtc_4_floor[auVar102[0]] * 2 |
                   (uint)(byte)g_pvrtc_5_floor[auVar100[0]] << 5 |
                   (uint)(byte)g_pvrtc_5_floor[auVar99[0]] << 10 | 0x8000;
        }
        else {
          if (0xf < (byte)(g_pvrtc_4_floor[auVar100[0]] | g_pvrtc_4_floor[auVar99[0]])) {
LAB_001431ea:
            __assert_fail("(r < 16) && (g < 16) && (b < 8) && (a < 8)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc5f,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          if (7 < (byte)(g_pvrtc_3_floor[auVar102[0]] | g_pvrtc_alpha_floor[auVar101._0_4_ & 0xff]))
          goto LAB_001431ea;
          uVar20 = ((uint)(byte)g_pvrtc_4_floor[auVar100[0]] << 4 |
                   (uint)(byte)g_pvrtc_4_floor[auVar99[0]] << 8 |
                   (uint)(byte)g_pvrtc_alpha_floor[auVar101._0_4_ & 0xff] << 0xc) +
                   (uint)(byte)g_pvrtc_3_floor[auVar102[0]] * 2;
        }
        bVar38 = local_2a8.field_0.r ^ 0xff;
        bVar64 = (byte)uStack_2a4 ^ 0xff;
        bVar65 = (byte)uStack_2a0 ^ 0xff;
        bVar66 = bStack_29c ^ 0xff;
        bVar67 = (byte)uStack_298 ^ 0xff;
        bVar68 = (byte)local_294 ^ 0xff;
        bVar69 = (byte)local_290 ^ 0xff;
        bVar70 = local_28c ^ 0xff;
        bVar71 = local_288 ^ 0xff;
        bVar72 = local_284 ^ 0xff;
        bVar73 = local_280 ^ 0xff;
        bVar74 = local_27c ^ 0xff;
        bVar75 = local_278 ^ 0xff;
        bVar76 = local_274 ^ 0xff;
        bVar77 = local_270 ^ 0xff;
        bVar78 = local_26c ^ 0xff;
        auVar103[0] = (bVar38 < bVar64) * bVar38 | (bVar38 >= bVar64) * bVar64;
        auVar103[1] = 0;
        auVar103[2] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar103[3] = 0;
        auVar103[4] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar103[5] = 0;
        auVar103[6] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar103[7] = 0;
        auVar103[8] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar103[9] = 0;
        auVar103[10] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar103[0xb] = 0;
        auVar103[0xc] = (bVar75 < bVar76) * bVar75 | (bVar75 >= bVar76) * bVar76;
        auVar103[0xd] = 0;
        auVar103[0xe] = (bVar77 < bVar78) * bVar77 | (bVar77 >= bVar78) * bVar78;
        auVar103[0xf] = 0;
        auVar102 = phminposuw(auVar103);
        bVar38 = local_2a8.field_0.g ^ 0xff;
        bVar64 = uStack_2a4._1_1_ ^ 0xff;
        bVar65 = uStack_2a0._1_1_ ^ 0xff;
        bVar66 = bStack_29b ^ 0xff;
        bVar67 = uStack_298._1_1_ ^ 0xff;
        bVar68 = local_294._1_1_ ^ 0xff;
        bVar69 = local_290._1_1_ ^ 0xff;
        bVar70 = local_28b ^ 0xff;
        bVar71 = local_287 ^ 0xff;
        bVar72 = local_283 ^ 0xff;
        bVar73 = local_27f ^ 0xff;
        bVar74 = local_27b ^ 0xff;
        bVar75 = local_277 ^ 0xff;
        bVar76 = local_273 ^ 0xff;
        bVar77 = local_26f ^ 0xff;
        bVar78 = local_26b ^ 0xff;
        auVar98[0] = (bVar38 < bVar64) * bVar38 | (bVar38 >= bVar64) * bVar64;
        auVar98[1] = 0;
        auVar98[2] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar98[3] = 0;
        auVar98[4] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar98[5] = 0;
        auVar98[6] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar98[7] = 0;
        auVar98[8] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar98[9] = 0;
        auVar98[10] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar98[0xb] = 0;
        auVar98[0xc] = (bVar75 < bVar76) * bVar75 | (bVar75 >= bVar76) * bVar76;
        auVar98[0xd] = 0;
        auVar98[0xe] = (bVar77 < bVar78) * bVar77 | (bVar77 >= bVar78) * bVar78;
        auVar98[0xf] = 0;
        auVar101 = phminposuw(auVar98);
        bVar38 = local_2a8.field_0.b ^ 0xff;
        bVar64 = uStack_2a4._2_1_ ^ 0xff;
        bVar65 = uStack_2a0._2_1_ ^ 0xff;
        bVar66 = bStack_29a ^ 0xff;
        bVar67 = uStack_298._2_1_ ^ 0xff;
        bVar68 = local_294._2_1_ ^ 0xff;
        bVar69 = local_290._2_1_ ^ 0xff;
        bVar70 = local_28a ^ 0xff;
        bVar71 = local_286 ^ 0xff;
        bVar72 = local_282 ^ 0xff;
        bVar73 = local_27e ^ 0xff;
        bVar74 = local_27a ^ 0xff;
        bVar75 = local_276 ^ 0xff;
        bVar76 = local_272 ^ 0xff;
        bVar77 = local_26e ^ 0xff;
        bVar78 = local_26a ^ 0xff;
        auVar97[0] = (bVar38 < bVar64) * bVar38 | (bVar38 >= bVar64) * bVar64;
        auVar97[1] = 0;
        auVar97[2] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar97[3] = 0;
        auVar97[4] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar97[5] = 0;
        auVar97[6] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar97[7] = 0;
        auVar97[8] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar97[9] = 0;
        auVar97[10] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar97[0xb] = 0;
        auVar97[0xc] = (bVar75 < bVar76) * bVar75 | (bVar75 >= bVar76) * bVar76;
        auVar97[0xd] = 0;
        auVar97[0xe] = (bVar77 < bVar78) * bVar77 | (bVar77 >= bVar78) * bVar78;
        auVar97[0xf] = 0;
        auVar100 = phminposuw(auVar97);
        bVar38 = local_2a8.field_0.a ^ 0xff;
        bVar64 = uStack_2a4._3_1_ ^ 0xff;
        bVar65 = uStack_2a0._3_1_ ^ 0xff;
        bVar66 = bStack_299 ^ 0xff;
        bVar67 = uStack_298._3_1_ ^ 0xff;
        bVar68 = local_294._3_1_ ^ 0xff;
        bVar69 = local_290._3_1_ ^ 0xff;
        bVar70 = local_289 ^ 0xff;
        bVar71 = local_285 ^ 0xff;
        bVar72 = local_281 ^ 0xff;
        bVar73 = local_27d ^ 0xff;
        bVar74 = local_279 ^ 0xff;
        bVar75 = local_275 ^ 0xff;
        bVar76 = local_271 ^ 0xff;
        bVar77 = local_26d ^ 0xff;
        bVar78 = local_269 ^ 0xff;
        auVar80[0] = (bVar38 < bVar64) * bVar38 | (bVar38 >= bVar64) * bVar64;
        auVar80[1] = 0;
        auVar80[2] = (bVar65 < bVar66) * bVar65 | (bVar65 >= bVar66) * bVar66;
        auVar80[3] = 0;
        auVar80[4] = (bVar67 < bVar68) * bVar67 | (bVar67 >= bVar68) * bVar68;
        auVar80[5] = 0;
        auVar80[6] = (bVar69 < bVar70) * bVar69 | (bVar69 >= bVar70) * bVar70;
        auVar80[7] = 0;
        auVar80[8] = (bVar71 < bVar72) * bVar71 | (bVar71 >= bVar72) * bVar72;
        auVar80[9] = 0;
        auVar80[10] = (bVar73 < bVar74) * bVar73 | (bVar73 >= bVar74) * bVar74;
        auVar80[0xb] = 0;
        auVar80[0xc] = (bVar75 < bVar76) * bVar75 | (bVar75 >= bVar76) * bVar76;
        auVar80[0xd] = 0;
        auVar80[0xe] = (bVar77 < bVar78) * bVar77 | (bVar77 >= bVar78) * bVar78;
        auVar80[0xf] = 0;
        auVar99 = phminposuw(auVar80);
        bVar38 = ~auVar99[0];
        if ((ulong)bVar38 - 0xef < 0x11) {
          if (0x1f < (byte)((&g_pvrtc_5_ceil)[(byte)~auVar101[0]] |
                            (&g_pvrtc_5_ceil)[(byte)~auVar102[0]] |
                           (&g_pvrtc_5_ceil)[(byte)~auVar100[0]])) {
            __assert_fail("(r < 32) && (g < 32) && (b < 32)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc55,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          uVar20 = ((uint)(byte)(&g_pvrtc_5_ceil)[(byte)~auVar101[0]] << 5 |
                    (uint)(byte)(&g_pvrtc_5_ceil)[(byte)~auVar102[0]] << 10 |
                   (uint)(byte)(&g_pvrtc_5_ceil)[(byte)~auVar100[0]]) << 0x10 | uVar20 | 0x80000000;
        }
        else {
          if (0xee < bVar38) {
LAB_00143209:
            __assert_fail("(r < 16) && (g < 16) && (b < 16) && (a < 8)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0xc66,
                          "void basist::pvrtc4_block::set_endpoint_raw(uint32_t, const color32 &, bool)"
                         );
          }
          if (0xf < (byte)((&g_pvrtc_4_ceil)[(byte)~auVar101[0]] |
                           (&g_pvrtc_4_ceil)[(byte)~auVar102[0]] |
                          (&g_pvrtc_4_ceil)[(byte)~auVar100[0]])) goto LAB_00143209;
          uVar20 = (uint)(byte)g_pvrtc_alpha_ceil[bVar38] << 0x1c | uVar20 |
                   ((uint)(byte)(&g_pvrtc_4_ceil)[(byte)~auVar101[0]] << 4 |
                    (uint)(byte)(&g_pvrtc_4_ceil)[(byte)~auVar102[0]] << 8 |
                   (uint)(byte)(&g_pvrtc_4_ceil)[(byte)~auVar100[0]]) << 0x10;
        }
        if (uVar19 <= uVar60) {
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                        ,0x178,
                        "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]");
        }
        *(uint *)((long)local_250 + uVar60 * 4) = uVar20;
        uVar60 = uVar60 + 1;
        blk = blk + 1;
        uVar34 = uVar34 - 1;
      } while (uVar34 != 0);
      uVar27 = uVar27 + 1;
      bVar63 = local_198 <= uVar27;
      uVar21 = uVar21 + (int)local_1c8;
    } while (uVar27 != local_198);
    uVar21 = (int)local_1c8 - 1;
    local_1a4 = (int)local_1d0 - 1;
    uVar19 = 0x1f;
    if (uVar21 != 0) {
      for (; uVar21 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    uVar19 = (uVar19 ^ 0xffffffe0) + 0x21;
    if (uVar21 == 0) {
      uVar19 = 0;
    }
    uVar20 = 0x1f;
    if (local_1a4 != 0) {
      for (; local_1a4 >> uVar20 == 0; uVar20 = uVar20 - 1) {
      }
    }
    uVar20 = (uVar20 ^ 0xffffffe0) + 0x21;
    if (local_1a4 == 0) {
      uVar20 = 0;
    }
    if (uVar19 < uVar20) {
      uVar20 = uVar19;
    }
    local_190 = (ulong)uVar20;
    local_230 = uVar20 * 2;
    if (0 < (int)local_1d0) {
      local_1ac = ~(-1 << ((byte)local_230 & 0x1f));
      uVar27 = 0;
      local_1d8 = 0;
      local_20c = uVar21;
      do {
        local_268 = uVar27 + 0xffffffff;
        paVar62 = &local_2a8;
        puVar54 = &local_98;
        lVar37 = 0;
        local_1e0 = uVar27;
        do {
          uVar19 = local_20c;
          pvVar41 = (void *)((long)local_250 +
                            (ulong)(((int)local_268 + (int)lVar37 & local_1a4) * (int)local_1c8) * 4
                            );
          local_48[lVar37] = (long)pvVar41;
          uVar21 = 0xffffffff;
          lVar56 = 0;
          do {
            uVar10 = *(uint32_t *)((long)pvVar41 + (ulong)(uVar21 & uVar19) * 4);
            uVar9 = get_endpoint_l8(uVar10,0);
            *(uint32_t *)((long)paVar62 + lVar56) = uVar9;
            uVar10 = get_endpoint_l8(uVar10,1);
            *(uint32_t *)((long)puVar54 + lVar56) = uVar10;
            lVar56 = lVar56 + 0x10;
            uVar21 = uVar21 + 1;
          } while (lVar56 != 0x30);
          lVar37 = lVar37 + 1;
          puVar54 = puVar54 + 1;
          paVar62 = paVar62 + 1;
        } while (lVar37 != 3);
        local_2b0 = (ulong)local_2a8.m;
        uVar27 = (ulong)local_98;
        if (0 < (int)local_1c8) {
          local_1b0 = ((uint)local_1e0 >> ((byte)local_190 & 0x1f)) << ((byte)local_230 & 0x1f);
          local_1a8 = CONCAT22((&g_pvrtc_swizzle_table)[local_1e0 >> 8 & 0xffffff],
                               (&g_pvrtc_swizzle_table)[local_1e0 & 0xff]);
          local_e0 = local_48[0];
          local_e8 = local_48[1];
          local_f0 = local_48[2];
          local_2b8 = (ulong)uStack_2a4;
          local_258 = (ulong)uStack_2a0;
          local_238 = (ulong)local_88;
          local_260 = (ulong)local_94;
          local_2c0 = (ulong)local_90;
          uVar51 = (ulong)local_290;
          uVar18 = (ulong)local_80;
          uVar34 = 0;
          uVar60 = (ulong)uStack_298;
          local_248 = (ulong)local_84;
          local_240 = (ulong)local_294;
          do {
            pvVar41 = local_188;
            uVar7 = local_1c8;
            uVar6 = local_1d0;
            uVar5 = local_248;
            local_1e8 = uVar60 & 0xffffffff;
            local_268 = local_240;
            local_1c0 = local_238;
            local_1f8 = uVar18 & 0xffffffff;
            uVar19 = (uint)uVar34;
            uVar60 = (ulong)((int)local_1d8 + uVar19);
            local_1f0 = uVar51;
            local_178 = uVar27;
            unpack_uastc(local_180 + uVar60,(color32 *)&local_138.field_0,false);
            uVar21 = (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar34 & 0xff] * 2 |
                     (uint)(ushort)(&g_pvrtc_swizzle_table)[uVar34 >> 8 & 0xffffff] << 0x11 |
                     local_1a8;
            if ((uint)uVar7 != (uint)uVar6) {
              if ((uint)uVar6 < (uint)uVar7) {
                uVar21 = uVar21 & local_1ac |
                         (uVar19 >> ((byte)local_190 & 0x1f)) << ((byte)local_230 & 0x1f);
              }
              else {
                uVar21 = uVar21 & local_1ac | local_1b0;
              }
            }
            local_b8 = (ulong)uVar21;
            *(undefined4 *)((long)pvVar41 + local_b8 * 8 + 4) =
                 *(undefined4 *)((long)local_250 + uVar60 * 4);
            local_a0 = (ulong)(uVar19 + 1);
            uVar27 = (ulong)(uVar19 + 1 & local_20c);
            uVar10 = *(uint32_t *)(local_e0 + uVar27 * 4);
            uVar9 = get_endpoint_l8(uVar10,0);
            local_1b8 = CONCAT44(extraout_var,uVar9);
            uVar10 = get_endpoint_l8(uVar10,1);
            local_238 = CONCAT44(extraout_var_00,uVar10);
            uVar10 = *(uint32_t *)(local_e8 + uVar27 * 4);
            uVar9 = get_endpoint_l8(uVar10,0);
            uVar11 = get_endpoint_l8(uVar10,1);
            uVar10 = *(uint32_t *)(local_f0 + uVar27 * 4);
            uVar12 = get_endpoint_l8(uVar10,0);
            uVar51 = (ulong)uVar12;
            uVar10 = get_endpoint_l8(uVar10,1);
            uVar18 = CONCAT44(extraout_var_01,uVar10);
            uVar19 = (uint)local_268;
            uVar21 = (uint)uVar5;
            iVar22 = uVar9 * 3 + uVar19 * 9;
            iVar39 = uVar11 * 3 + uVar21 * 9;
            uVar20 = (uint)local_1f0;
            uVar1 = (uint)local_1f8;
            iVar57 = uVar20 * 3 + uVar12 + iVar22;
            iVar13 = uVar10 + uVar1 * 3 + iVar39;
            auVar99 = pmovzxbw(ZEXT416(uStack_fc),ZEXT416(uStack_fc));
            sVar79 = auVar99._4_2_;
            auVar81._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar81._2_2_ = sVar96 + auVar99._2_2_;
            auVar81._4_2_ = sVar79 * 2;
            auVar81._6_2_ = sVar96 * 2;
            auVar81._8_2_ = sVar79 + auVar99._8_2_;
            auVar81._10_2_ = sVar96 + auVar99._10_2_;
            auVar81._12_2_ = sVar79 + auVar99._12_2_;
            auVar81._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar81,auVar81);
            local_210 = (uint)auVar100._0_2_ * 0x100 + iVar57 * -0x10;
            if (iVar13 < iVar57) {
              local_210 = -local_210;
            }
            uVar2 = iVar13 - iVar57;
            if (iVar13 < iVar57) {
              uVar2 = -(iVar13 - iVar57);
            }
            local_140 = (ulong)uVar2;
            iVar13 = uVar19 * 0xc;
            iVar57 = uVar21 * 0xc;
            iVar14 = iVar13 + uVar20 * 4;
            iVar58 = iVar57 + uVar1 * 4;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_fc,local_100));
            sVar79 = auVar99._4_2_;
            auVar82._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar82._2_2_ = sVar96 + auVar99._2_2_;
            auVar82._4_2_ = sVar79 * 2;
            auVar82._6_2_ = sVar96 * 2;
            auVar82._8_2_ = sVar79 + auVar99._8_2_;
            auVar82._10_2_ = sVar96 + auVar99._10_2_;
            auVar82._12_2_ = sVar79 + auVar99._12_2_;
            auVar82._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar82,auVar82);
            local_214 = (uint)auVar99._0_2_ * 0x100 + iVar14 * -0x10;
            if (iVar58 < iVar14) {
              local_214 = -local_214;
            }
            auVar99 = pmovzxbw(ZEXT416(local_10c),ZEXT416(local_10c));
            sVar79 = auVar99._4_2_;
            auVar83._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar83._2_2_ = sVar96 + auVar99._2_2_;
            auVar83._4_2_ = sVar79 * 2;
            auVar83._6_2_ = sVar96 * 2;
            auVar83._8_2_ = sVar79 + auVar99._8_2_;
            auVar83._10_2_ = sVar96 + auVar99._10_2_;
            auVar83._12_2_ = sVar79 + auVar99._12_2_;
            auVar83._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar83,auVar83);
            iVar15 = iVar13 + uVar9 * 4;
            iVar61 = iVar57 + uVar11 * 4;
            uVar33 = iVar58 - iVar14;
            if (iVar58 < iVar14) {
              uVar33 = -(iVar58 - iVar14);
            }
            local_c0 = (ulong)uVar33;
            local_218 = (uint)auVar99._0_2_ * 0x100 + iVar15 * -0x10;
            if (iVar61 < iVar15) {
              local_218 = -local_218;
            }
            uVar32 = iVar61 - iVar15;
            if (iVar61 < iVar15) {
              uVar32 = -(iVar61 - iVar15);
            }
            local_148 = (ulong)uVar32;
            iVar58 = uVar21 * 0x10;
            iVar15 = (uint)local_10e + (uint)local_10f + (local_110 - uVar19) + (uint)local_10d;
            local_19c = iVar15 * 0x100;
            iVar14 = iVar58 + uVar19 * -0x10;
            if (SBORROW4(iVar58,uVar19 * 0x10) != iVar14 < 0) {
              local_19c = iVar15 * -0x100;
            }
            uVar52 = iVar58 + uVar19 * -0x10;
            iVar15 = (int)local_2b8;
            if (SBORROW4(iVar58,uVar19 * 0x10) != (int)uVar52 < 0) {
              uVar52 = -iVar14;
            }
            local_150 = (ulong)uVar52;
            iVar14 = (int)local_260;
            iVar58 = iVar15 * 3 + uVar19 * 9;
            iVar53 = iVar14 * 3 + uVar21 * 9;
            iVar61 = uVar20 * 3 + (int)local_258 + iVar58;
            iVar42 = uVar1 * 3 + (int)local_2c0 + iVar53;
            auVar99 = pmovzxbw(ZEXT416(uStack_104),ZEXT416(uStack_104));
            sVar79 = auVar99._4_2_;
            auVar84._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar84._2_2_ = sVar96 + auVar99._2_2_;
            auVar84._4_2_ = sVar79 * 2;
            auVar84._6_2_ = sVar96 * 2;
            auVar84._8_2_ = sVar79 + auVar99._8_2_;
            auVar84._10_2_ = sVar96 + auVar99._10_2_;
            auVar84._12_2_ = sVar79 + auVar99._12_2_;
            auVar84._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar84,auVar84);
            uVar29 = iVar42 - iVar61;
            if (iVar42 < iVar61) {
              uVar29 = -(iVar42 - iVar61);
            }
            local_158 = (ulong)uVar29;
            local_21c = (uint)auVar100._0_2_ * 0x100 + iVar61 * -0x10;
            if (iVar42 < iVar61) {
              local_21c = -local_21c;
            }
            iVar42 = uVar19 + iVar15;
            uVar30 = iVar14 + uVar21;
            local_d8 = (ulong)uVar30;
            uVar28 = iVar42 * 6;
            local_c8 = (ulong)uVar28;
            uVar23 = uVar30 * 6;
            local_d0 = (ulong)uVar23;
            iVar35 = uVar28 + ((int)local_258 + uVar20) * 2;
            iVar43 = uVar23 + ((int)local_2c0 + uVar1) * 2;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_104,local_108));
            sVar79 = auVar99._4_2_;
            auVar85._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar85._2_2_ = sVar96 + auVar99._2_2_;
            auVar85._4_2_ = sVar79 * 2;
            auVar85._6_2_ = sVar96 * 2;
            auVar85._8_2_ = sVar79 + auVar99._8_2_;
            auVar85._10_2_ = sVar96 + auVar99._10_2_;
            auVar85._12_2_ = sVar79 + auVar99._12_2_;
            auVar85._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar85,auVar85);
            iVar61 = iVar43 - iVar35;
            if (iVar43 < iVar35) {
              iVar61 = -(iVar43 - iVar35);
            }
            local_220 = (uint)auVar99._0_2_ * 0x100 + iVar35 * -0x10;
            if (iVar43 < iVar35) {
              local_220 = -local_220;
            }
            iVar35 = iVar13 + iVar15 * 4;
            iVar43 = iVar57 + iVar14 * 4;
            auVar99 = pmovzxbw(ZEXT416(uStack_114),ZEXT416(uStack_114));
            sVar79 = auVar99._4_2_;
            auVar86._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar86._2_2_ = sVar96 + auVar99._2_2_;
            auVar86._4_2_ = sVar79 * 2;
            auVar86._6_2_ = sVar96 * 2;
            auVar86._8_2_ = sVar79 + auVar99._8_2_;
            auVar86._10_2_ = sVar96 + auVar99._10_2_;
            auVar86._12_2_ = sVar79 + auVar99._12_2_;
            auVar86._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar86,auVar86);
            uVar47 = iVar43 - iVar35;
            if (iVar43 < iVar35) {
              uVar47 = -(iVar43 - iVar35);
            }
            local_160 = (ulong)uVar47;
            local_1a0 = (uint)auVar100._0_2_ * 0x100 + iVar35 * -0x10;
            if (iVar43 < iVar35) {
              local_1a0 = -local_1a0;
            }
            iVar35 = uVar30 * 8;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_114,local_118));
            sVar79 = auVar99._4_2_;
            auVar87._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar87._2_2_ = sVar96 + auVar99._2_2_;
            auVar87._4_2_ = sVar79 * 2;
            auVar87._6_2_ = sVar96 * 2;
            auVar87._8_2_ = sVar79 + auVar99._8_2_;
            auVar87._10_2_ = sVar96 + auVar99._10_2_;
            auVar87._12_2_ = sVar79 + auVar99._12_2_;
            auVar87._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar87,auVar87);
            uVar31 = iVar35 + iVar42 * -8;
            if (SBORROW4(iVar35,iVar42 * 8) != (int)uVar31 < 0) {
              uVar31 = -(iVar35 + iVar42 * -8);
            }
            local_168 = (ulong)uVar31;
            local_224 = (uint)auVar99._0_2_ * 0x100 + iVar42 * -0x80;
            if (SBORROW4(iVar35,iVar42 * 8) != iVar35 + iVar42 * -8 < 0) {
              local_224 = -local_224;
            }
            aVar3.m = (uint32_t)local_1e8;
            uVar4 = (uint)local_1c0;
            uVar44 = (uint)local_1b8;
            iVar22 = iVar22 + uVar44 + aVar3.m * 3;
            uVar45 = (uint)local_238;
            iVar39 = iVar39 + uVar45 + uVar4 * 3;
            auVar99 = pmovzxbw(ZEXT416(uStack_11c),ZEXT416(uStack_11c));
            sVar79 = auVar99._4_2_;
            auVar88._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar88._2_2_ = sVar96 + auVar99._2_2_;
            auVar88._4_2_ = sVar79 * 2;
            auVar88._6_2_ = sVar96 * 2;
            auVar88._8_2_ = sVar79 + auVar99._8_2_;
            auVar88._10_2_ = sVar96 + auVar99._10_2_;
            auVar88._12_2_ = sVar79 + auVar99._12_2_;
            auVar88._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar88,auVar88);
            iVar35 = iVar39 - iVar22;
            if (iVar39 < iVar22) {
              iVar35 = -(iVar39 - iVar22);
            }
            local_228 = (uint)auVar100._0_2_ * 0x100 + iVar22 * -0x10;
            if (iVar39 < iVar22) {
              local_228 = -local_228;
            }
            iVar13 = iVar13 + aVar3.m * 4;
            iVar57 = iVar57 + uVar4 * 4;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_11c,local_120));
            sVar79 = auVar99._4_2_;
            auVar89._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar89._2_2_ = sVar96 + auVar99._2_2_;
            auVar89._4_2_ = sVar79 * 2;
            auVar89._6_2_ = sVar96 * 2;
            auVar89._8_2_ = sVar79 + auVar99._8_2_;
            auVar89._10_2_ = sVar96 + auVar99._10_2_;
            auVar89._12_2_ = sVar79 + auVar99._12_2_;
            auVar89._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar89,auVar89);
            iVar22 = iVar57 - iVar13;
            if (iVar57 < iVar13) {
              iVar22 = -(iVar57 - iVar13);
            }
            local_22c = (uint)auVar99._0_2_ * 0x100 + iVar13 * -0x10;
            if (iVar57 < iVar13) {
              local_22c = -local_22c;
            }
            iVar43 = aVar3.m + uVar19;
            iVar57 = (uVar4 + uVar21) * 6;
            iVar13 = iVar43 * 6 + (uVar9 + uVar44) * 2;
            iVar39 = iVar57 + (uVar45 + uVar11) * 2;
            auVar99 = pmovzxbw(ZEXT416(uStack_12c),ZEXT416(uStack_12c));
            sVar79 = auVar99._4_2_;
            auVar90._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar90._2_2_ = sVar96 + auVar99._2_2_;
            auVar90._4_2_ = sVar79 * 2;
            auVar90._6_2_ = sVar96 * 2;
            auVar90._8_2_ = sVar79 + auVar99._8_2_;
            auVar90._10_2_ = sVar96 + auVar99._10_2_;
            auVar90._12_2_ = sVar79 + auVar99._12_2_;
            auVar90._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar90,auVar90);
            uVar26 = iVar39 - iVar13;
            if (iVar39 < iVar13) {
              uVar26 = -(iVar39 - iVar13);
            }
            local_170 = (ulong)uVar26;
            iVar49 = (uint)auVar100._0_2_ * 0x100 + iVar13 * -0x10;
            if (iVar39 < iVar13) {
              iVar49 = -iVar49;
            }
            iVar39 = (uVar4 + uVar21) * 8;
            iVar13 = iVar39 + iVar43 * -8;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_12c,local_130));
            sVar79 = auVar99._4_2_;
            auVar91._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar91._2_2_ = sVar96 + auVar99._2_2_;
            auVar91._4_2_ = sVar79 * 2;
            auVar91._6_2_ = sVar96 * 2;
            auVar91._8_2_ = sVar79 + auVar99._8_2_;
            auVar91._10_2_ = sVar96 + auVar99._10_2_;
            auVar91._12_2_ = sVar79 + auVar99._12_2_;
            auVar91._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar91,auVar91);
            if (SBORROW4(iVar39,iVar43 * 8) != iVar13 < 0) {
              iVar13 = -(iVar39 + iVar43 * -8);
            }
            iVar50 = (uint)auVar99._0_2_ * 0x100 + iVar43 * -0x80;
            if (SBORROW4(iVar39,iVar43 * 8) != iVar39 + iVar43 * -8 < 0) {
              iVar50 = -iVar50;
            }
            iVar55 = (int)local_2b0;
            iVar58 = iVar58 + aVar3.m * 3 + iVar55;
            iVar59 = (int)local_178;
            iVar53 = iVar53 + uVar4 * 3 + iVar59;
            auVar99 = pmovzxbw(ZEXT416(uStack_124),ZEXT416(uStack_124));
            sVar79 = auVar99._4_2_;
            auVar92._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar92._2_2_ = sVar96 + auVar99._2_2_;
            auVar92._4_2_ = sVar79 * 2;
            auVar92._6_2_ = sVar96 * 2;
            auVar92._8_2_ = sVar79 + auVar99._8_2_;
            auVar92._10_2_ = sVar96 + auVar99._10_2_;
            auVar92._12_2_ = sVar79 + auVar99._12_2_;
            auVar92._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar92,auVar92);
            iVar39 = iVar53 - iVar58;
            if (iVar53 < iVar58) {
              iVar39 = -(iVar53 - iVar58);
            }
            iVar46 = (uint)auVar100._0_2_ * 0x100 + iVar58 * -0x10;
            if (iVar53 < iVar58) {
              iVar46 = -iVar46;
            }
            iVar53 = uVar28 + (aVar3.m + iVar55) * 2;
            iVar40 = uVar23 + (uVar4 + iVar59) * 2;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_124,local_128));
            sVar79 = auVar99._4_2_;
            auVar93._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar93._2_2_ = sVar96 + auVar99._2_2_;
            auVar93._4_2_ = sVar79 * 2;
            auVar93._6_2_ = sVar96 * 2;
            auVar93._8_2_ = sVar79 + auVar99._8_2_;
            auVar93._10_2_ = sVar96 + auVar99._10_2_;
            auVar93._12_2_ = sVar79 + auVar99._12_2_;
            auVar93._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar93,auVar93);
            iVar58 = iVar40 - iVar53;
            if (iVar40 < iVar53) {
              iVar58 = -(iVar40 - iVar53);
            }
            iVar16 = (uint)auVar99._0_2_ * 0x100 + iVar53 * -0x10;
            if (iVar40 < iVar53) {
              iVar16 = -iVar16;
            }
            iVar15 = iVar43 * 6 + (iVar55 + iVar15) * 2;
            iVar57 = iVar57 + (iVar59 + iVar14) * 2;
            auVar99 = pmovzxbw(ZEXT416(uStack_134),ZEXT416(uStack_134));
            sVar79 = auVar99._4_2_;
            auVar94._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar94._2_2_ = sVar96 + auVar99._2_2_;
            auVar94._4_2_ = sVar79 * 2;
            auVar94._6_2_ = sVar96 * 2;
            auVar94._8_2_ = sVar79 + auVar99._8_2_;
            auVar94._10_2_ = sVar96 + auVar99._10_2_;
            auVar94._12_2_ = sVar79 + auVar99._12_2_;
            auVar94._14_2_ = sVar96 + auVar99._14_2_;
            auVar100 = phaddw(auVar94,auVar94);
            iVar14 = iVar57 - iVar15;
            if (iVar57 < iVar15) {
              iVar14 = -(iVar57 - iVar15);
            }
            iVar53 = (uint)auVar100._0_2_ * 0x100 + iVar15 * -0x10;
            if (iVar57 < iVar15) {
              iVar53 = -iVar53;
            }
            iVar42 = aVar3.m + iVar55 + iVar42;
            iVar15 = (uVar4 + iVar59 + uVar30) * 4;
            iVar57 = iVar15 + iVar42 * -4;
            auVar99 = pmovzxbw(auVar99,CONCAT44(uStack_134,local_138.m));
            sVar79 = auVar99._4_2_;
            auVar95._0_2_ = sVar79 + auVar99._0_2_;
            sVar96 = auVar99._6_2_;
            auVar95._2_2_ = sVar96 + auVar99._2_2_;
            auVar95._4_2_ = sVar79 * 2;
            auVar95._6_2_ = sVar96 * 2;
            auVar95._8_2_ = sVar79 + auVar99._8_2_;
            auVar95._10_2_ = sVar96 + auVar99._10_2_;
            auVar95._12_2_ = sVar79 + auVar99._12_2_;
            auVar95._14_2_ = sVar96 + auVar99._14_2_;
            auVar99 = phaddw(auVar95,auVar95);
            if (SBORROW4(iVar15,iVar42 * 4) != iVar57 < 0) {
              iVar57 = -(iVar15 + iVar42 * -4);
            }
            iVar43 = (uint)auVar99._0_2_ * 0x100 + iVar42 * -0x40;
            if (SBORROW4(iVar15,iVar42 * 4) != iVar15 + iVar42 * -4 < 0) {
              iVar43 = -iVar43;
            }
            uVar23 = 2;
            if (iVar43 == iVar57 * 8 || SBORROW4(iVar43,iVar57 * 8) != iVar43 + iVar57 * -8 < 0) {
              uVar23 = (uint)(iVar43 != iVar57 * 3 &&
                             SBORROW4(iVar43,iVar57 * 3) == iVar43 + iVar57 * -3 < 0);
            }
            uVar28 = 3;
            if (iVar43 <= iVar57 * 0xd) {
              uVar28 = uVar23;
            }
            iVar57 = 8;
            if (iVar53 == iVar14 * 8 || SBORROW4(iVar53,iVar14 * 8) != iVar53 + iVar14 * -8 < 0) {
              iVar57 = (uint)(iVar53 != iVar14 * 3 &&
                             SBORROW4(iVar53,iVar14 * 3) == iVar53 + iVar14 * -3 < 0) << 2;
            }
            iVar15 = 0xc;
            if (iVar53 <= iVar14 * 0xd) {
              iVar15 = iVar57;
            }
            iVar57 = 0x200;
            if (iVar16 == iVar58 * 8 || SBORROW4(iVar16,iVar58 * 8) != iVar16 + iVar58 * -8 < 0) {
              iVar57 = (uint)(iVar16 != iVar58 * 3 &&
                             SBORROW4(iVar16,iVar58 * 3) == iVar16 + iVar58 * -3 < 0) << 8;
            }
            iVar14 = 0x300;
            if (iVar16 <= iVar58 * 0xd) {
              iVar14 = iVar57;
            }
            uVar23 = 0x800;
            if (iVar46 == iVar39 * 8 || SBORROW4(iVar46,iVar39 * 8) != iVar46 + iVar39 * -8 < 0) {
              uVar23 = (uint)(iVar46 != iVar39 * 3 &&
                             SBORROW4(iVar46,iVar39 * 3) == iVar46 + iVar39 * -3 < 0) << 10;
            }
            uVar30 = 0xc00;
            if (iVar46 <= iVar39 * 0xd) {
              uVar30 = uVar23;
            }
            local_208 = (ulong)uVar30;
            uVar23 = 0x20;
            if (iVar50 == iVar13 * 8 || SBORROW4(iVar50,iVar13 * 8) != iVar50 + iVar13 * -8 < 0) {
              uVar23 = (uint)(iVar50 != iVar13 * 3 &&
                             SBORROW4(iVar50,iVar13 * 3) == iVar50 + iVar13 * -3 < 0) << 4;
            }
            uVar17 = 0x30;
            if (iVar50 <= iVar13 * 0xd) {
              uVar17 = uVar23;
            }
            uVar23 = 0x80;
            if (iVar49 == uVar26 * 8 ||
                SBORROW4(iVar49,uVar26 * 8) != (int)(iVar49 + uVar26 * -8) < 0) {
              uVar23 = (uint)((int)(uVar26 * 3) < iVar49) << 6;
            }
            uVar25 = 0xc0;
            if (iVar49 <= (int)(uVar26 * 0xd)) {
              uVar25 = uVar23;
            }
            uVar23 = 0x2000;
            if (local_22c == iVar22 * 8 ||
                SBORROW4(local_22c,iVar22 * 8) != local_22c + iVar22 * -8 < 0) {
              uVar23 = (uint)(iVar22 * 3 < local_22c) << 0xc;
            }
            uVar26 = 0x3000;
            if (local_22c <= iVar22 * 0xd) {
              uVar26 = uVar23;
            }
            uVar23 = 0x8000;
            if (local_228 == iVar35 * 8 ||
                SBORROW4(local_228,iVar35 * 8) != local_228 + iVar35 * -8 < 0) {
              uVar23 = (uint)(iVar35 * 3 < local_228) << 0xe;
            }
            uVar24 = 0xc000;
            if (local_228 <= iVar35 * 0xd) {
              uVar24 = uVar23;
            }
            local_200 = (ulong)uVar24;
            uVar23 = 0x20000;
            if (local_224 == uVar31 * 8 ||
                SBORROW4(local_224,uVar31 * 8) != (int)(local_224 + uVar31 * -8) < 0) {
              uVar23 = (uint)((int)(uVar31 * 3) < local_224) << 0x10;
            }
            uVar36 = 0x30000;
            if (local_224 <= (int)(uVar31 * 0xd)) {
              uVar36 = uVar23;
            }
            uVar23 = 0x80000;
            if (local_1a0 == uVar47 * 8 ||
                SBORROW4(local_1a0,uVar47 * 8) != (int)(local_1a0 + uVar47 * -8) < 0) {
              uVar23 = (uint)((int)(uVar47 * 3) < local_1a0) << 0x12;
            }
            uVar31 = 0xc0000;
            if (local_1a0 <= (int)(uVar47 * 0xd)) {
              uVar31 = uVar23;
            }
            uVar23 = 0x2000000;
            if (local_220 == iVar61 * 8 ||
                SBORROW4(local_220,iVar61 * 8) != local_220 + iVar61 * -8 < 0) {
              uVar23 = (uint)(iVar61 * 3 < local_220) << 0x18;
            }
            uVar47 = 0x3000000;
            if (local_220 <= iVar61 * 0xd) {
              uVar47 = uVar23;
            }
            uVar23 = 0x8000000;
            if (local_21c == uVar29 * 8 ||
                SBORROW4(local_21c,uVar29 * 8) != (int)(local_21c + uVar29 * -8) < 0) {
              uVar23 = (uint)((int)(uVar29 * 3) < local_21c) << 0x1a;
            }
            uVar48 = 0xc000000;
            if (local_21c <= (int)(uVar29 * 0xd)) {
              uVar48 = uVar23;
            }
            uVar29 = 0x200000;
            if (local_19c == uVar52 * 8 ||
                SBORROW4(local_19c,uVar52 * 8) != (int)(local_19c + uVar52 * -8) < 0) {
              uVar29 = (uint)((int)(uVar52 * 3) < local_19c) << 0x14;
            }
            uVar23 = 0x300000;
            if (local_19c <= (int)(uVar52 * 0xd)) {
              uVar23 = uVar29;
            }
            uVar52 = 0x800000;
            if (local_218 == uVar32 * 8 ||
                SBORROW4(local_218,uVar32 * 8) != (int)(local_218 + uVar32 * -8) < 0) {
              uVar52 = (uint)((int)(uVar32 * 3) < local_218) << 0x16;
            }
            uVar29 = 0xc00000;
            if (local_218 <= (int)(uVar32 * 0xd)) {
              uVar29 = uVar52;
            }
            uVar32 = 0x20000000;
            if (local_214 == uVar33 * 8 ||
                SBORROW4(local_214,uVar33 * 8) != (int)(local_214 + uVar33 * -8) < 0) {
              uVar32 = (uint)((int)(uVar33 * 3) < local_214) << 0x1c;
            }
            uVar52 = 0x30000000;
            if (local_214 <= (int)(uVar33 * 0xd)) {
              uVar52 = uVar32;
            }
            uVar33 = 0x80000000;
            if (local_210 == uVar2 * 8 ||
                SBORROW4(local_210,uVar2 * 8) != (int)(local_210 + uVar2 * -8) < 0) {
              uVar33 = (uint)((int)(uVar2 * 3) < local_210) << 0x1e;
            }
            uVar32 = 0xc0000000;
            if (local_210 <= (int)(uVar2 * 0xd)) {
              uVar32 = uVar33;
            }
            *(uint *)((long)local_188 + local_b8 * 8) =
                 uVar29 | uVar52 | uVar32 |
                 uVar36 | uVar31 | uVar47 | uVar48 | uVar23 |
                 uVar17 | uVar25 | uVar26 | uVar24 | iVar15 + uVar28 + iVar14 | uVar30;
            local_2c0 = local_1f8 & 0xffffffff;
            local_258 = local_1f0 & 0xffffffff;
            local_260 = uVar5;
            local_2b8 = local_268 & 0xffffffff;
            local_2b0 = local_1e8 & 0xffffffff;
            uVar27 = local_1c0 & 0xffffffff;
            uVar34 = local_a0;
            uVar60 = local_1b8;
            local_248 = (ulong)uVar11;
            local_240 = (ulong)uVar9;
            local_b0 = uVar18;
            local_a8 = uVar51;
          } while ((int)local_1c8 != (int)local_a0);
          local_1d8 = (ulong)(uint)((int)local_1d8 + (int)local_a0);
          local_2a8.m = aVar3.m;
          local_98 = uVar4;
          uStack_2a4 = uVar19;
          uStack_2a0 = uVar20;
          uStack_298 = uVar44;
          local_294 = uVar9;
          local_290 = uVar12;
          local_94 = uVar21;
          local_90 = uVar1;
          local_88 = uVar45;
          local_84 = uVar11;
          local_80 = uVar10;
        }
        uVar27 = local_1e0 + 1;
      } while (uVar27 != local_198);
      pvVar41 = local_58.m_p;
    }
    bVar63 = true;
LAB_001431af:
    if (pvVar41 != (void *)0x0) {
      free(pvVar41);
    }
  }
  return bVar63;
}

Assistant:

bool transcode_uastc_to_pvrtc1_4_rgba(const uastc_block* pSrc_blocks, void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, bool high_quality)
	{
		BASISU_NOTE_UNUSED(high_quality);

		if ((!num_blocks_x) || (!num_blocks_y))
			return false;

		const uint32_t width = num_blocks_x * 4;
		const uint32_t height = num_blocks_y * 4;
		if (!basisu::is_pow2(width) || !basisu::is_pow2(height))
			return false;

		basisu::vector<uint32_t> temp_endpoints(num_blocks_x * num_blocks_y);

		for (uint32_t y = 0; y < num_blocks_y; y++)
		{
			for (uint32_t x = 0; x < num_blocks_x; x++)
			{
				color32 block_pixels[16];
				if (!unpack_uastc(pSrc_blocks[x + y * num_blocks_x], block_pixels, false))
					return false;

				// Get block's RGBA bounding box 
				color32 low_color(255, 255, 255, 255), high_color(0, 0, 0, 0);

				for (uint32_t i = 0; i < 16; i++)
				{
					low_color = color32::comp_min(low_color, block_pixels[i]);
					high_color = color32::comp_max(high_color, block_pixels[i]);
				}

				// Set PVRTC1 endpoints to floor/ceil of bounding box's coordinates.
				pvrtc4_block temp;
				temp.set_endpoint_floor(0, low_color);
				temp.set_endpoint_ceil(1, high_color);

				temp_endpoints[x + y * num_blocks_x] = temp.m_endpoints;
			}
		}

		fixup_pvrtc1_4_modulation_rgba(pSrc_blocks, &temp_endpoints[0], pDst_blocks, num_blocks_x, num_blocks_y);

		return true;
	}